

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void SanitizeFormatString(char *fmt,char *fmt_out,size_t fmt_out_size)

{
  byte *pbVar1;
  byte *pbVar2;
  uint uVar3;
  
  pbVar1 = (byte *)ImParseFormatFindEnd(fmt);
  if (pbVar1 + (1 - (long)fmt) < (byte *)0x20) {
    while (pbVar2 = (byte *)fmt, pbVar2 < pbVar1) {
      uVar3 = *pbVar2 - 0x24;
      if ((0x3b < uVar3) ||
         (fmt = (char *)(pbVar2 + 1), (0x800000000000009U >> ((ulong)uVar3 & 0x3f) & 1) == 0)) {
        *fmt_out = *pbVar2;
        fmt_out = (char *)((byte *)fmt_out + 1);
        fmt = (char *)(pbVar2 + 1);
      }
    }
    *fmt_out = 0;
    return;
  }
  __assert_fail("(size_t)(fmt_end - fmt + 1) < fmt_out_size",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_widgets.cpp"
                ,0x880,"void SanitizeFormatString(const char *, char *, size_t)");
}

Assistant:

static void SanitizeFormatString(const char* fmt, char* fmt_out, size_t fmt_out_size)
{
    IM_UNUSED(fmt_out_size);
    const char* fmt_end = ImParseFormatFindEnd(fmt);
    IM_ASSERT((size_t)(fmt_end - fmt + 1) < fmt_out_size); // Format is too long, let us know if this happens to you!
    while (fmt < fmt_end)
    {
        char c = *(fmt++);
        if (c != '\'' && c != '$' && c != '_') // Custom flags provided by stb_sprintf.h. POSIX 2008 also supports '.
            *(fmt_out++) = c;
    }
    *fmt_out = 0; // Zero-terminate
}